

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  code *pcVar2;
  char **ppcVar3;
  MbcType MVar4;
  uint uVar5;
  MbcType MVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  size_t sVar10;
  int *piVar11;
  byte bVar12;
  byte *pbVar13;
  byte *pbVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  FILE *pFVar19;
  char *fmt;
  FILE *__stream;
  char *pcVar20;
  MbcType MVar21;
  byte *pbVar22;
  char **ppcVar23;
  char *pcVar24;
  bool bVar25;
  char *endptr;
  stat local_c0;
  
  nbErrors = '\0';
LAB_00101ba5:
  pFVar19 = (FILE *)(ulong)(uint)argc;
  uVar5 = musl_getopt_long_only(argc,argv,"Ccf:i:jk:l:m:n:Op:r:st:Vv",longopts,(int *)0x0);
  pcVar24 = musl_optarg;
  if ((int)uVar5 < 0x56) {
    if (uVar5 == 0x43) {
switchD_00101bdb_caseD_63:
      model = (uVar5 != 99) + BOTH;
      if (0xf < titleLen) {
        main_cold_12();
      }
    }
    else {
      if (uVar5 != 0x4f) {
        if (uVar5 != 0xffffffff) goto switchD_00101bdb_caseD_57;
        if (((cartridgeType >> 8 & 0xff) == 1) && (japanese == '\x01')) {
          main_cold_13();
        }
        __stream = _stderr;
        if ((ramSize != 0x200) &&
           (pFVar19 = (FILE *)(ulong)cartridgeType, (cartridgeType & 0xff00) == ROM)) {
          if ((cartridgeType & 0xffff00fe) == ROM_RAM) {
            if (ramSize != 1) {
              main_cold_16();
            }
          }
          else if ((int)cartridgeType < 0xfd) {
            if (cartridgeType < (MBC7_SENSOR_RUMBLE_RAM_BATTERY|MBC1)) {
              if ((0x46c0d330cU >> ((ulong)cartridgeType & 0x3f) & 1) == 0) {
                if ((0x112028863U >> ((ulong)cartridgeType & 0x3f) & 1) != 0) goto LAB_00102c70;
                goto LAB_00102c54;
              }
            }
            else {
LAB_00102c54:
              if (cartridgeType != POCKET_CAMERA) {
LAB_00102e82:
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
            }
LAB_00102c29:
            if (ramSize == 0) {
              main_cold_15();
            }
            else if (ramSize == 1) {
              main_cold_14();
            }
          }
          else {
            if (3 < cartridgeType - MBC_NONE) {
              if (cartridgeType - HUC3 < 2) goto LAB_00102c29;
              if (cartridgeType != BANDAI_TAMA5) goto LAB_00102e82;
            }
LAB_00102c70:
            if (ramSize != 0) {
              pcVar24 = mbcName(cartridgeType);
              fprintf(__stream,"warning: MBC \"%s\" has no RAM, but RAM size was set to %u\n",
                      pcVar24);
              pFVar19 = __stream;
            }
          }
        }
        if (((sgb == '\x01') && (oldLicensee != 0x33)) && (oldLicensee != 0x200)) {
          pFVar19 = _stderr;
          fprintf(_stderr,
                  "warning: SGB compatibility enabled, but old licensee is 0x%02x, not 0x33\n");
        }
        if (argv[musl_optind] == (char *)0x0) {
LAB_00102edb:
          main_cold_17();
          switch((ulong)pFVar19 & 0xffffffff) {
          case 0:
            return 0x106230;
          case 1:
            return 0x10624c;
          case 2:
            return 0x106251;
          case 3:
            return 0x10625a;
          case 4:
          case 7:
          case 10:
          case 0xe:
          case 0x14:
          case 0x15:
          case 0x16:
          case 0x17:
          case 0x18:
          case 0x1f:
          case 0x21:
            goto switchD_00102ef5_caseD_4;
          case 5:
            return 0x10626b;
          case 6:
            return 0x106270;
          case 8:
            return 0x106234;
          case 9:
            return 0x10623c;
          case 0xb:
            return 0x10627d;
          case 0xc:
            return 0x106283;
          case 0xd:
            return 0x10628d;
          case 0xf:
            return 0x1062a4;
          case 0x10:
            return 0x1062b7;
          case 0x11:
            return 0x10629f;
          case 0x12:
            return 0x1062ce;
          case 0x13:
            return 0x1062d7;
          case 0x19:
            return 0x1062e8;
          case 0x1a:
            return 0x1062ed;
          case 0x1b:
            return 0x1062f6;
          case 0x1c:
            return 0x106307;
          case 0x1d:
            return 0x106313;
          case 0x1e:
            return 0x106323;
          case 0x20:
            return 0x10633b;
          case 0x22:
            return 0x106340;
          default:
            switch((int)pFVar19) {
            case 0xfc:
              return 0x10635f;
            case 0xfd:
              return 0x10636d;
            case 0xfe:
              return 0x10637a;
            case 0xff:
              return 0x10637f;
            case 0x100:
              return 0x106390;
            case 0x101:
              return 0x106395;
            case 0x102:
            case 0x103:
              return 0x1063a1;
            case 0x104:
              return 0x1063b2;
            case 0x105:
              return 0x1063bd;
            case 0x106:
            case 0x107:
              return 0x1063cf;
            case 0x108:
              return 0x1063e6;
            case 0x109:
              return 0x1063f3;
            case 0x10a:
            case 0x10b:
              return 0x106407;
            case 0x10c:
              return 0x106420;
            case 0x10d:
              return 0x106433;
            case 0x10e:
            case 0x10f:
              return 0x10644d;
            }
switchD_00102ef5_caseD_4:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
        }
        bVar25 = nbErrors != '\0';
        ppcVar3 = argv + musl_optind;
        goto LAB_00102ccf;
      }
      overwriteRom = 1;
    }
    goto LAB_00101ba5;
  }
  switch(uVar5) {
  case 0x56:
    goto switchD_00101bdb_caseD_56;
  default:
switchD_00101bdb_caseD_57:
    pFVar19 = (FILE *)(ulong)uVar5;
    main_cold_18();
    goto LAB_00102edb;
  case 99:
    goto switchD_00101bdb_caseD_63;
  case 0x66:
    fixSpec = '\0';
    do {
      bVar12 = *musl_optarg;
      if (bVar12 < 0x67) {
        if (bVar12 < 0x48) {
          if (bVar12 == 0x47) {
            if ((fixSpec & 8) != 0) {
              main_cold_6();
            }
            fixSpec = fixSpec & 0xf3 | 4;
          }
          else {
            if (bVar12 == 0) goto LAB_00101ba5;
LAB_00101ce8:
            fprintf(_stderr,"warning: Ignoring \'%c\' in fix spec\n",(ulong)(uint)(int)(char)bVar12)
            ;
          }
        }
        else if (bVar12 == 0x48) {
          if ((fixSpec & 0x20) != 0) {
            main_cold_8();
          }
          fixSpec = fixSpec & 0xcf | 0x10;
        }
        else {
          if (bVar12 != 0x4c) goto LAB_00101ce8;
          if ((char)fixSpec < '\0') {
            main_cold_10();
          }
          fixSpec = fixSpec & 0x3f | 0x40;
        }
      }
      else if (bVar12 == 0x67) {
        if ((fixSpec & 4) != 0) {
          main_cold_7();
        }
        fixSpec = fixSpec & 0xf3 | 8;
      }
      else if (bVar12 == 0x68) {
        if ((fixSpec & 0x10) != 0) {
          main_cold_9();
        }
        fixSpec = fixSpec & 0xcf | 0x20;
      }
      else {
        if (bVar12 != 0x6c) goto LAB_00101ce8;
        if ((fixSpec & 0x40) != 0) {
          main_cold_11();
        }
        fixSpec = fixSpec & 0x3f | 0x80;
      }
      musl_optarg = musl_optarg + 1;
    } while( true );
  case 0x69:
    gameID = musl_optarg;
    sVar10 = strlen(musl_optarg);
    if (4 < sVar10) {
      fprintf(_stderr,"warning: Truncating game ID \"%s\" to 4 chars\n",pcVar24);
      sVar10 = 4;
    }
    gameIDLen = (uint8_t)sVar10;
    if (0xb < titleLen) {
      main_cold_5();
    }
    goto LAB_00101ba5;
  case 0x6a:
    japanese = '\x01';
    goto LAB_00101ba5;
  case 0x6b:
    newLicensee = musl_optarg;
    sVar10 = strlen(musl_optarg);
    if (2 < sVar10) {
      fprintf(_stderr,"warning: Truncating new licensee \"%s\" to 2 chars\n",pcVar24);
      sVar10 = 2;
    }
    newLicenseeLen = (uint8_t)sVar10;
    goto LAB_00101ba5;
  case 0x6c:
    if (*musl_optarg == '$') {
      pcVar24 = musl_optarg + 1;
      iVar7 = 0x10;
    }
    else {
      if (*musl_optarg == '\0') {
        pcVar24 = "error: Argument to option \'l\' may not be empty\n";
LAB_001025d6:
        report(pcVar24);
        goto LAB_00101ba5;
      }
      iVar7 = 0;
    }
    pcVar24 = (char *)strtoul(pcVar24,(char **)&local_c0,iVar7);
    if (*(byte *)local_c0.st_dev == 0) {
      if (pcVar24 < (char *)0x100) {
        oldLicensee = (uint16_t)pcVar24;
        goto LAB_00101ba5;
      }
      pcVar20 = "error: Argument to option \'l\' is larger than 255: %lu\n";
    }
    else {
      pcVar20 = "error: Expected number as argument to option \'l\', got %s\n";
      pcVar24 = musl_optarg;
    }
    break;
  case 0x6d:
    iVar7 = strcasecmp(musl_optarg,"help");
    if (iVar7 != 0) {
      cVar1 = *pcVar24;
      if (cVar1 == '$' || (byte)(cVar1 - 0x30U) < 10) {
        uVar9 = strtoul(pcVar24 + (cVar1 == '$'),(char **)&local_c0,(uint)(cVar1 == '$') << 4);
        MVar6 = (MbcType)uVar9;
        if (0xff < uVar9) {
          MVar6 = MBC_BAD_RANGE;
        }
        if (*(byte *)local_c0.st_dev != 0) {
          MVar6 = MBC_BAD;
        }
      }
      else {
        for (pbVar22 = (byte *)(pcVar24 + 2);
            (bVar12 = pbVar22[-2], bVar12 == 0x20 || (bVar12 == 9)); pbVar22 = pbVar22 + 1) {
        }
        pbVar13 = pbVar22 + -1;
        MVar6 = MBC_BAD;
        if (bVar12 < 0x62) {
          switch(bVar12) {
          case 0x4d:
switchD_00101fd0_caseD_4d:
            bVar12 = *pbVar13;
            if (bVar12 < 0x62) {
              if (bVar12 == 0x42) {
LAB_00102574:
                if (((*pbVar22 | 0x20) == 99) && (pbVar22[1] - 0x31 < 7)) {
                  pbVar13 = pbVar22 + 2;
                  switch((uint)pbVar22[1]) {
                  case 0x31:
                    MVar21 = MBC1;
                    break;
                  case 0x32:
                    MVar21 = MBC2;
                    break;
                  case 0x33:
                    MVar21 = MBC3;
                    break;
                  case 0x34:
                    goto switchD_00101fd0_caseD_4e;
                  case 0x35:
                    MVar21 = MBC5;
                    break;
                  case 0x36:
                    MVar21 = MBC6;
                    break;
                  case 0x37:
                    MVar21 = MBC7_SENSOR_RUMBLE_RAM_BATTERY;
                  }
                  goto LAB_001026c6;
                }
              }
              else if (bVar12 == 0x4d) {
LAB_0010251e:
                pbVar14 = (byte *)0x10627f;
                do {
                  bVar12 = *pbVar14;
                  pbVar13 = pbVar22;
                  if (bVar12 == 0) break;
                  bVar15 = *pbVar22;
                  if (bVar15 == 0) {
                    bVar25 = false;
                  }
                  else {
                    bVar17 = bVar15 + 0x9f;
                    bVar16 = bVar15 - 0x20;
                    if (bVar15 == 0x5f) {
                      bVar15 = 0x20;
                    }
                    if (0x19 < bVar17) {
                      bVar16 = bVar15;
                    }
                    pbVar14 = pbVar14 + 1;
                    bVar25 = bVar16 == bVar12;
                  }
                  pbVar22 = pbVar22 + 1;
                  pbVar13 = pbVar22;
                } while (bVar25);
                if (bVar12 == 0) {
                  MVar21 = MMM01;
                  goto LAB_001026c6;
                }
              }
            }
            else {
              if (bVar12 == 0x62) goto LAB_00102574;
              if (bVar12 == 0x6d) goto LAB_0010251e;
            }
            break;
          case 0x4e:
          case 0x4f:
          case 0x51:
          case 0x53:
            break;
          case 0x50:
switchD_00101fd0_caseD_50:
            pbVar22 = (byte *)0x106360;
            do {
              bVar12 = *pbVar22;
              if (bVar12 == 0) break;
              bVar15 = *pbVar13;
              if (bVar15 == 0) {
                bVar25 = false;
              }
              else {
                bVar16 = bVar15 + 0x9f;
                bVar17 = bVar15 - 0x20;
                if (bVar15 == 0x5f) {
                  bVar15 = 0x20;
                }
                if (0x19 < bVar16) {
                  bVar17 = bVar15;
                }
                pbVar22 = pbVar22 + 1;
                bVar25 = bVar17 == bVar12;
              }
              pbVar13 = pbVar13 + 1;
            } while (bVar25);
            if (bVar12 == 0) {
              MVar21 = POCKET_CAMERA;
              goto LAB_001026c6;
            }
            break;
          case 0x52:
switchD_00101fd0_caseD_52:
            pbVar22 = (byte *)0x106231;
            do {
              bVar12 = *pbVar22;
              if (bVar12 == 0) break;
              bVar15 = *pbVar13;
              if (bVar15 == 0) {
                bVar25 = false;
              }
              else {
                bVar16 = bVar15 + 0x9f;
                bVar17 = bVar15 - 0x20;
                if (bVar15 == 0x5f) {
                  bVar15 = 0x20;
                }
                if (0x19 < bVar16) {
                  bVar17 = bVar15;
                }
                pbVar22 = pbVar22 + 1;
                bVar25 = bVar17 == bVar12;
              }
              pbVar13 = pbVar13 + 1;
            } while (bVar25);
            if (bVar12 == 0) {
              do {
                bVar12 = *pbVar13;
                if (bVar12 < 0x4f) {
                  if ((bVar12 != 9) && (bVar12 != 0x20)) goto LAB_00102696;
                }
                else if (bVar12 != 0x5f) {
                  if ((bVar12 == 0x4f) || (bVar12 == 0x6f)) {
                    pbVar13 = pbVar13 + 1;
                    pcVar24 = "NLY";
                    goto LAB_0010264c;
                  }
                  goto LAB_00102696;
                }
                pbVar13 = pbVar13 + 1;
              } while( true );
            }
            break;
          case 0x54:
switchD_00101fd0_caseD_54:
            if (*pbVar13 == 0x41) {
              pbVar14 = (byte *)0x106376;
              do {
                bVar12 = *pbVar14;
                pbVar13 = pbVar22;
                if (bVar12 == 0) break;
                bVar15 = *pbVar22;
                if (bVar15 == 0) {
                  bVar25 = false;
                }
                else {
                  bVar17 = bVar15 + 0x9f;
                  bVar16 = bVar15 - 0x20;
                  if (bVar15 == 0x5f) {
                    bVar15 = 0x20;
                  }
                  if (0x19 < bVar17) {
                    bVar16 = bVar15;
                  }
                  pbVar14 = pbVar14 + 1;
                  bVar25 = bVar16 == bVar12;
                }
                pbVar22 = pbVar22 + 1;
                pbVar13 = pbVar22;
              } while (bVar25);
              if (bVar12 == 0) {
                MVar21 = BANDAI_TAMA5;
                goto LAB_001026c6;
              }
            }
            else if (*pbVar13 == 0x50) {
              pbVar13 = (byte *)0x106392;
              do {
                bVar12 = *pbVar13;
                if (bVar12 == 0) break;
                bVar15 = *pbVar22;
                if (bVar15 == 0) {
                  bVar25 = false;
                }
                else {
                  bVar17 = bVar15 + 0x9f;
                  bVar16 = bVar15 - 0x20;
                  if (bVar15 == 0x5f) {
                    bVar15 = 0x20;
                  }
                  if (0x19 < bVar17) {
                    bVar16 = bVar15;
                  }
                  pbVar13 = pbVar13 + 1;
                  bVar25 = bVar16 == bVar12;
                }
                pbVar22 = pbVar22 + 1;
              } while (bVar25);
              if (bVar12 == 0) {
                for (; (*pbVar22 == 0x5f || (*pbVar22 == 0x20)); pbVar22 = pbVar22 + 1) {
                }
                uVar9 = strtoul((char *)pbVar22,(char **)&local_c0,10);
                pcVar24 = "error: Failed to parse TPP1 major revision number\n";
                if ((pbVar22 == (byte *)local_c0.st_dev) ||
                   (pcVar24 = "error: RGBFIX only supports TPP1 versions 1.0\n", uVar9 != 1)) {
LAB_00102b7e:
                  report(pcVar24);
                }
                else {
                  tpp1Rev[0] = '\x01';
                  pcVar24 = ".";
                  pbVar22 = (byte *)local_c0.st_dev;
                  do {
                    bVar12 = *pcVar24;
                    if (bVar12 == 0) break;
                    bVar15 = *pbVar22;
                    if (bVar15 == 0) {
                      bVar25 = false;
                    }
                    else {
                      bVar17 = bVar15 + 0x9f;
                      bVar16 = bVar15 - 0x20;
                      if (bVar15 == 0x5f) {
                        bVar15 = 0x20;
                      }
                      if (0x19 < bVar17) {
                        bVar16 = bVar15;
                      }
                      pcVar24 = (char *)((byte *)pcVar24 + 1);
                      bVar25 = bVar16 == bVar12;
                    }
                    pbVar22 = pbVar22 + 1;
                  } while (bVar25);
                  if (bVar12 == 0) {
                    uVar9 = strtoul((char *)pbVar22,(char **)&local_c0,10);
                    pcVar24 = "error: Failed to parse TPP1 minor revision number\n";
                    if (((byte *)local_c0.st_dev != pbVar22) &&
                       (pcVar24 = "error: TPP1 minor revision number must be 8-bit\n", uVar9 < 0x100
                       )) {
                      tpp1Rev[1] = (uint8_t)uVar9;
                      MVar21 = TPP1;
                      pbVar13 = (byte *)local_c0.st_dev;
                      goto LAB_001026c6;
                    }
                    goto LAB_00102b7e;
                  }
                }
LAB_00102b85:
                MVar6 = MBC_BAD;
              }
            }
            break;
          default:
            if (bVar12 == 0x42) {
LAB_001023ab:
              pbVar22 = (byte *)0x10636e;
              do {
                bVar12 = *pbVar22;
                if (bVar12 == 0) break;
                bVar15 = *pbVar13;
                if (bVar15 == 0) {
                  bVar25 = false;
                }
                else {
                  bVar16 = bVar15 + 0x9f;
                  bVar17 = bVar15 - 0x20;
                  if (bVar15 == 0x5f) {
                    bVar15 = 0x20;
                  }
                  if (0x19 < bVar16) {
                    bVar17 = bVar15;
                  }
                  pbVar22 = pbVar22 + 1;
                  bVar25 = bVar17 == bVar12;
                }
                pbVar13 = pbVar13 + 1;
              } while (bVar25);
              if (bVar12 == 0) {
                MVar21 = BANDAI_TAMA5;
                goto LAB_001026c6;
              }
            }
            else if (bVar12 == 0x48) {
LAB_00102118:
              pcVar24 = "UC";
              do {
                bVar12 = *pcVar24;
                if (bVar12 == 0) break;
                bVar15 = *pbVar13;
                if (bVar15 == 0) {
                  bVar25 = false;
                }
                else {
                  bVar16 = bVar15 + 0x9f;
                  bVar17 = bVar15 - 0x20;
                  if (bVar15 == 0x5f) {
                    bVar15 = 0x20;
                  }
                  if (0x19 < bVar16) {
                    bVar17 = bVar15;
                  }
                  pcVar24 = (char *)((byte *)pcVar24 + 1);
                  bVar25 = bVar17 == bVar12;
                }
                pbVar13 = pbVar13 + 1;
              } while (bVar25);
              if (bVar12 == 0) {
                if (*pbVar13 == 0x31) {
                  MVar21 = HUC1_RAM_BATTERY;
                  pbVar13 = pbVar13 + 1;
                  goto LAB_001026c6;
                }
                if (*pbVar13 == 0x33) {
                  MVar21 = HUC3;
                  pbVar13 = pbVar13 + 1;
                  goto LAB_001026c6;
                }
              }
            }
          }
        }
        else {
          switch(bVar12) {
          case 0x6d:
            goto switchD_00101fd0_caseD_4d;
          case 0x6e:
          case 0x6f:
          case 0x71:
          case 0x73:
            break;
          case 0x70:
            goto switchD_00101fd0_caseD_50;
          case 0x72:
            goto switchD_00101fd0_caseD_52;
          case 0x74:
            goto switchD_00101fd0_caseD_54;
          default:
            if (bVar12 == 0x62) goto LAB_001023ab;
            if (bVar12 == 0x68) goto LAB_00102118;
          }
        }
      }
      goto switchD_00101fd0_caseD_4e;
    }
    main_cold_4();
switchD_00101bdb_caseD_56:
    pcVar24 = get_package_version_string();
    printf("rgbfix %s\n",pcVar24);
    exit(0);
  case 0x6e:
    if (*musl_optarg == '$') {
      pcVar24 = musl_optarg + 1;
      iVar7 = 0x10;
    }
    else {
      if (*musl_optarg == '\0') {
        pcVar24 = "error: Argument to option \'n\' may not be empty\n";
        goto LAB_001025d6;
      }
      iVar7 = 0;
    }
    pcVar24 = (char *)strtoul(pcVar24,(char **)&local_c0,iVar7);
    if (*(byte *)local_c0.st_dev == 0) {
      if (pcVar24 < (char *)0x100) {
        romVersion = (uint16_t)pcVar24;
        goto LAB_00101ba5;
      }
      pcVar20 = "error: Argument to option \'n\' is larger than 255: %lu\n";
    }
    else {
      pcVar20 = "error: Expected number as argument to option \'n\', got %s\n";
      pcVar24 = musl_optarg;
    }
    break;
  case 0x70:
    if (*musl_optarg == '$') {
      pcVar24 = musl_optarg + 1;
      iVar7 = 0x10;
    }
    else {
      if (*musl_optarg == '\0') {
        pcVar24 = "error: Argument to option \'p\' may not be empty\n";
        goto LAB_001025d6;
      }
      iVar7 = 0;
    }
    pcVar24 = (char *)strtoul(pcVar24,(char **)&local_c0,iVar7);
    if (*(byte *)local_c0.st_dev == 0) {
      if (pcVar24 < (char *)0x100) {
        padValue = (uint16_t)pcVar24;
        goto LAB_00101ba5;
      }
      pcVar20 = "error: Argument to option \'p\' is larger than 255: %lu\n";
    }
    else {
      pcVar20 = "error: Expected number as argument to option \'p\', got %s\n";
      pcVar24 = musl_optarg;
    }
    break;
  case 0x72:
    if (*musl_optarg == '$') {
      pcVar24 = musl_optarg + 1;
      iVar7 = 0x10;
    }
    else {
      if (*musl_optarg == '\0') {
        pcVar24 = "error: Argument to option \'r\' may not be empty\n";
        goto LAB_001025d6;
      }
      iVar7 = 0;
    }
    pcVar24 = (char *)strtoul(pcVar24,(char **)&local_c0,iVar7);
    if (*(byte *)local_c0.st_dev == 0) {
      if (pcVar24 < (char *)0x100) {
        ramSize = (uint16_t)pcVar24;
        goto LAB_00101ba5;
      }
      pcVar20 = "error: Argument to option \'r\' is larger than 255: %lu\n";
    }
    else {
      pcVar20 = "error: Expected number as argument to option \'r\', got %s\n";
      pcVar24 = musl_optarg;
    }
    break;
  case 0x73:
    sgb = '\x01';
    goto LAB_00101ba5;
  case 0x74:
    title = musl_optarg;
    sVar10 = strlen(musl_optarg);
    bVar12 = (model == DMG) + 0xf;
    if (gameID != (char *)0x0) {
      bVar12 = 0xb;
    }
    uVar9 = (ulong)bVar12;
    if (uVar9 < sVar10) {
      fprintf(_stderr,"warning: Truncating title \"%s\" to %u chars\n",pcVar24,uVar9);
      sVar10 = uVar9;
    }
    titleLen = (uint8_t)sVar10;
    goto LAB_00101ba5;
  case 0x76:
    goto switchD_00101bdb_caseD_76;
  }
  report(pcVar20,pcVar24);
  goto LAB_00101ba5;
switchD_00101bdb_caseD_76:
  fixSpec = 0xa8;
  goto LAB_00101ba5;
  while( true ) {
    bVar15 = *pbVar13;
    if (bVar15 == 0) {
      bVar25 = false;
    }
    else {
      bVar16 = bVar15 + 0x9f;
      bVar17 = bVar15 - 0x20;
      if (bVar15 == 0x5f) {
        bVar15 = 0x20;
      }
      if (0x19 < bVar16) {
        bVar17 = bVar15;
      }
      pcVar24 = (char *)((byte *)pcVar24 + 1);
      bVar25 = bVar17 == bVar12;
    }
    pbVar13 = pbVar13 + 1;
    if (!bVar25) break;
LAB_0010264c:
    bVar12 = *pcVar24;
    if (bVar12 == 0) break;
  }
  if (bVar12 == 0) {
LAB_00102696:
    MVar21 = ROM;
LAB_001026c6:
    uVar9 = 0;
LAB_001026c9:
    bVar12 = (byte)uVar9;
    pbVar22 = pbVar13 + 2;
LAB_001026d0:
    bVar15 = *pbVar13;
    if (0x1f < bVar15) {
      if ((bVar15 != 0x20) && (bVar15 != 0x5f)) goto LAB_001026f6;
LAB_001026ee:
      pbVar13 = pbVar13 + 1;
      pbVar22 = pbVar22 + 1;
      goto LAB_001026d0;
    }
    if (bVar15 == 9) goto LAB_001026ee;
    if (bVar15 != 0) goto LAB_00102b85;
    MVar4 = MVar21;
    if (MVar21 < MBC6) {
      iVar7 = (int)uVar9;
      if (MVar21 < MMM01) {
        if (MVar21 == ROM) {
          MVar21 = MBC2_BATTERY|MBC1;
          if (bVar12 == 0) goto LAB_00102b63;
        }
        else if (MVar21 != MBC1) {
          if ((MVar21 != MBC2) || (bVar12 == 0)) goto LAB_00102b63;
          MVar6 = MBC_WRONG_FEATURES;
          MVar4 = MBC2_BATTERY;
          if (iVar7 == 0x40) goto LAB_00102b63;
          goto switchD_00101fd0_caseD_4e;
        }
      }
      else if (MVar21 != MMM01) {
        if (MVar21 == MBC3) {
          if ((uVar9 & 0x20) != 0) {
            if ((uVar9 & 0x40) == 0) {
              main_cold_2();
            }
            bVar12 = bVar12 & 0x9c;
            MVar21 = MBC3_TIMER_BATTERY;
          }
          MVar4 = MVar21;
          if (bVar12 == 0) goto LAB_00102b63;
        }
        else {
          if (MVar21 != MBC5) goto LAB_00102b63;
          bVar12 = bVar12 & 0xec;
          if ((uVar9 & 0x10) != 0) {
            MVar21 = MBC5_RUMBLE;
          }
          MVar4 = MVar21;
          if ((uVar9 & 0xec) == 0) goto LAB_00102b63;
        }
        if (bVar12 == 0xc0) {
          MVar4 = MVar21 + MBC1_RAM;
        }
        else {
          MVar6 = MBC_WRONG_FEATURES;
          if (bVar12 != 0x80) goto switchD_00101fd0_caseD_4e;
          MVar4 = MVar21 + MBC1;
        }
        goto LAB_00102b63;
      }
      MVar4 = MVar21;
      if (bVar12 == 0) goto LAB_00102b63;
      if (iVar7 == 0xc0) {
        MVar4 = MVar21 + MBC1_RAM;
      }
      else {
        MVar6 = MBC_WRONG_FEATURES;
        if (iVar7 != 0x80) goto switchD_00101fd0_caseD_4e;
        MVar4 = MVar21 + MBC1;
      }
      goto LAB_00102b63;
    }
    if (MVar21 < POCKET_CAMERA) {
      if (MVar21 != MBC6) {
        if ((MVar21 != MBC7_SENSOR_RUMBLE_RAM_BATTERY) ||
           (MVar6 = MBC_WRONG_FEATURES, bVar12 == 0xd8)) goto LAB_00102b63;
        goto switchD_00101fd0_caseD_4e;
      }
LAB_00102a9d:
      MVar6 = MBC_WRONG_FEATURES;
      if (bVar12 == 0) goto LAB_00102b63;
      goto switchD_00101fd0_caseD_4e;
    }
    if (MVar21 - POCKET_CAMERA < 3) goto LAB_00102a9d;
    if (MVar21 == HUC1_RAM_BATTERY) {
      MVar6 = MBC_WRONG_FEATURES;
      if (bVar12 != 0xc0) goto switchD_00101fd0_caseD_4e;
      goto LAB_00102b63;
    }
    if (MVar21 != TPP1) goto LAB_00102b63;
    if ((char)bVar12 < '\0') {
      main_cold_1();
    }
    MVar6 = TPP1;
    if ((uVar9 & 0x40) != 0) {
      MVar6 = TPP1_BATTERY;
    }
    MVar6 = (byte)(uVar9 >> 3) & 4 | MVar6;
    MVar21 = MVar6 | MBC1_RAM_BATTERY;
    if ((uVar9 & 4) == 0) {
      MVar21 = MVar6;
    }
    MVar6 = MBC_WRONG_FEATURES;
    if ((uVar9 & 8) != 0) goto switchD_00101fd0_caseD_4e;
    MVar4 = MVar21 | bVar12 >> 4 & 1;
LAB_00102b63:
    for (; (MVar6 = MVar4, bVar12 = *pbVar13, bVar12 == 9 || (bVar12 == 0x20));
        pbVar13 = pbVar13 + 1) {
      MVar4 = MVar6;
    }
    if (bVar12 != 0) goto LAB_00102b85;
  }
switchD_00101fd0_caseD_4e:
  cartridgeType = MVar6;
  if (MVar6 != MBC_BAD_RANGE) {
    if (MVar6 == MBC_WRONG_FEATURES) {
      pcVar24 = "error: Features incompatible with MBC (\"%s\")\nAccepted combinations:\n";
    }
    else {
      if (MVar6 != MBC_BAD) {
        if ((MVar6 & ~MBC1) == ROM_RAM) {
          main_cold_3();
        }
        goto LAB_00101ba5;
      }
      pcVar24 = "error: Unknown MBC \"%s\"\nAccepted MBC names:\n";
    }
    report(pcVar24,musl_optarg);
    printAcceptedMBCNames();
    goto LAB_00101ba5;
  }
  report("error: Specified MBC ID out of range 0-255: %s\n",musl_optarg);
  goto LAB_00101ba5;
LAB_001026f6:
  if (bVar15 != 0x2b) goto LAB_00102b85;
  for (; ((bVar15 = pbVar22[-1], bVar15 == 9 || (bVar15 == 0x5f)) || (bVar15 == 0x20));
      pbVar22 = pbVar22 + 1) {
  }
  if (0x61 < bVar15) {
    switch(bVar15) {
    case 0x6d:
      goto switchD_0010273b_caseD_4d;
    case 0x6e:
    case 0x6f:
    case 0x70:
    case 0x71:
      goto switchD_00101fd0_caseD_4e;
    case 0x72:
      goto switchD_0010273b_caseD_52;
    case 0x73:
      goto switchD_0010273b_caseD_53;
    case 0x74:
      goto switchD_0010273b_caseD_54;
    default:
      if (bVar15 != 0x62) goto switchD_00101fd0_caseD_4e;
      goto LAB_00102883;
    }
  }
  switch(bVar15) {
  case 0x4d:
switchD_0010273b_caseD_4d:
    pbVar13 = (byte *)0x1063a7;
    do {
      bVar15 = *pbVar13;
      if (bVar15 == 0) break;
      bVar17 = *pbVar22;
      if (bVar17 == 0) {
        bVar25 = false;
      }
      else {
        bVar18 = bVar17 + 0x9f;
        bVar16 = bVar17 - 0x20;
        if (bVar17 == 0x5f) {
          bVar17 = 0x20;
        }
        if (0x19 < bVar18) {
          bVar16 = bVar17;
        }
        pbVar13 = pbVar13 + 1;
        bVar25 = bVar16 == bVar15;
      }
      pbVar22 = pbVar22 + 1;
    } while (bVar25);
    bVar17 = 4;
    pbVar13 = pbVar22;
    break;
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
    goto switchD_00101fd0_caseD_4e;
  case 0x52:
switchD_0010273b_caseD_52:
    pbVar13 = pbVar22 + 1;
    bVar15 = *pbVar22;
    if (bVar15 < 0x61) {
      if (bVar15 == 0x41) {
LAB_00102945:
        if ((*pbVar13 | 0x20) != 0x6d) goto switchD_00101fd0_caseD_4e;
        pbVar13 = pbVar22 + 2;
        bVar17 = 0x80;
        goto LAB_001028d7;
      }
      if (bVar15 != 0x55) goto switchD_00101fd0_caseD_4e;
    }
    else {
      if (bVar15 == 0x61) goto LAB_00102945;
      if (bVar15 != 0x75) goto switchD_00101fd0_caseD_4e;
    }
    pbVar22 = (byte *)0x10639c;
    do {
      bVar15 = *pbVar22;
      if (bVar15 == 0) break;
      bVar17 = *pbVar13;
      if (bVar17 == 0) {
        bVar25 = false;
      }
      else {
        bVar18 = bVar17 + 0x9f;
        bVar16 = bVar17 - 0x20;
        if (bVar17 == 0x5f) {
          bVar17 = 0x20;
        }
        if (0x19 < bVar18) {
          bVar16 = bVar17;
        }
        pbVar22 = pbVar22 + 1;
        bVar25 = bVar16 == bVar15;
      }
      pbVar13 = pbVar13 + 1;
    } while (bVar25);
    bVar17 = 0x10;
    break;
  case 0x53:
switchD_0010273b_caseD_53:
    pcVar24 = "ENSOR";
    do {
      bVar15 = *pcVar24;
      if (bVar15 == 0) break;
      bVar17 = *pbVar22;
      if (bVar17 == 0) {
        bVar25 = false;
      }
      else {
        bVar18 = bVar17 + 0x9f;
        bVar16 = bVar17 - 0x20;
        if (bVar17 == 0x5f) {
          bVar17 = 0x20;
        }
        if (0x19 < bVar18) {
          bVar16 = bVar17;
        }
        pcVar24 = (char *)((byte *)pcVar24 + 1);
        bVar25 = bVar16 == bVar15;
      }
      pbVar22 = pbVar22 + 1;
    } while (bVar25);
    bVar17 = 8;
    pbVar13 = pbVar22;
    break;
  case 0x54:
switchD_0010273b_caseD_54:
    pbVar13 = (byte *)0x1063b8;
    do {
      bVar15 = *pbVar13;
      if (bVar15 == 0) break;
      bVar17 = *pbVar22;
      if (bVar17 == 0) {
        bVar25 = false;
      }
      else {
        bVar18 = bVar17 + 0x9f;
        bVar16 = bVar17 - 0x20;
        if (bVar17 == 0x5f) {
          bVar17 = 0x20;
        }
        if (0x19 < bVar18) {
          bVar16 = bVar17;
        }
        pbVar13 = pbVar13 + 1;
        bVar25 = bVar16 == bVar15;
      }
      pbVar22 = pbVar22 + 1;
    } while (bVar25);
    bVar17 = 0x20;
    pbVar13 = pbVar22;
    break;
  default:
    if (bVar15 != 0x42) goto switchD_00101fd0_caseD_4e;
LAB_00102883:
    pbVar13 = (byte *)0x1063ec;
    do {
      bVar15 = *pbVar13;
      if (bVar15 == 0) break;
      bVar17 = *pbVar22;
      if (bVar17 == 0) {
        bVar25 = false;
      }
      else {
        bVar18 = bVar17 + 0x9f;
        bVar16 = bVar17 - 0x20;
        if (bVar17 == 0x5f) {
          bVar17 = 0x20;
        }
        if (0x19 < bVar18) {
          bVar16 = bVar17;
        }
        pbVar13 = pbVar13 + 1;
        bVar25 = bVar16 == bVar15;
      }
      pbVar22 = pbVar22 + 1;
    } while (bVar25);
    bVar17 = 0x40;
    pbVar13 = pbVar22;
  }
  if (bVar15 != 0) goto switchD_00101fd0_caseD_4e;
LAB_001028d7:
  uVar9 = (ulong)(bVar12 | bVar17);
  goto LAB_001026c9;
LAB_00102ccf:
  ppcVar23 = ppcVar3 + 1;
  pcVar24 = *ppcVar3;
  nbErrors = '\0';
  iVar7 = strcmp(pcVar24,"-");
  if (iVar7 == 0) {
    processFile(0,1,"<stdin>",0);
    pcVar24 = "<stdin>";
  }
  else {
    iVar7 = open(pcVar24,2);
    if (iVar7 == -1) {
      piVar11 = __errno_location();
      pcVar20 = strerror(*piVar11);
      report("FATAL: Failed to open \"%s\" for reading+writing: %s\n",pcVar24,pcVar20);
    }
    else {
      iVar8 = fstat(iVar7,&local_c0);
      if (iVar8 == -1) {
        piVar11 = __errno_location();
        pcVar20 = strerror(*piVar11);
        fmt = "FATAL: Failed to stat \"%s\": %s\n";
LAB_00102e2b:
        report(fmt,pcVar24,pcVar20);
      }
      else if ((local_c0.st_mode & 0xf000) == 0x8000) {
        if (local_c0.st_size < 0x150) {
          fmt = "FATAL: \"%s\" too short, expected at least 336 ($150) bytes, got only %jd\n";
          pcVar20 = (char *)local_c0.st_size;
          goto LAB_00102e2b;
        }
        processFile(iVar7,iVar7,pcVar24,local_c0.st_size);
      }
      else {
        report("FATAL: \"%s\" is not a regular file, and thus cannot be modified in-place\n",pcVar24
              );
      }
      close(iVar7);
    }
  }
  uVar5 = (uint)nbErrors;
  if (uVar5 != 0) {
    pcVar20 = "s";
    if (uVar5 == 1) {
      pcVar20 = "";
    }
    fprintf(_stderr,"Fixing \"%s\" failed with %u error%s\n",pcVar24,(ulong)uVar5,pcVar20);
  }
  bVar25 = (bool)(bVar25 | nbErrors != '\0');
  ppcVar3 = ppcVar23;
  if (*ppcVar23 == (char *)0x0) {
    return (uint)bVar25;
  }
  goto LAB_00102ccf;
}

Assistant:

int main(int argc, char *argv[])
{
	nbErrors = 0;

	for (int ch; (ch = musl_getopt_long_only(argc, argv, optstring, longopts, NULL)) != -1;) {
		switch (ch) {
			size_t len;
#define parseByte(output, name) \
do { \
	char *endptr; \
	unsigned long tmp; \
	\
	if (musl_optarg[0] == 0) { \
		report("error: Argument to option '" name "' may not be empty\n"); \
	} else { \
		if (musl_optarg[0] == '$') { \
			tmp = strtoul(&musl_optarg[1], &endptr, 16); \
		} else { \
			tmp = strtoul(musl_optarg, &endptr, 0); \
		} \
		if (*endptr) \
			report("error: Expected number as argument to option '" name "', got %s\n", \
			       musl_optarg); \
		else if (tmp > 0xFF) \
			report("error: Argument to option '" name "' is larger than 255: %lu\n", tmp); \
		else \
			output = tmp; \
	} \
} while (0)

		case 'C':
		case 'c':
			model = ch == 'c' ? BOTH : CGB;
			if (titleLen > 15) {
				titleLen = 15;
				fprintf(stderr, "warning: Truncating title \"%s\" to 15 chars\n",
					title);
			}
			break;

		case 'f':
			fixSpec = 0;
			while (*musl_optarg) {
				switch (*musl_optarg) {
#define SPEC_l FIX_LOGO
#define SPEC_L TRASH_LOGO
#define SPEC_h FIX_HEADER_SUM
#define SPEC_H TRASH_HEADER_SUM
#define SPEC_g FIX_GLOBAL_SUM
#define SPEC_G TRASH_GLOBAL_SUM
#define overrideSpec(cur, bad) \
do { \
	if (fixSpec & SPEC_##bad) \
		fprintf(stderr, \
			"warning: '" #cur "' overriding '" #bad "' in fix spec\n"); \
	fixSpec = (fixSpec & ~SPEC_##bad) | SPEC_##cur; \
} while (0)
				case 'l':
					overrideSpec(l, L);
					break;
				case 'L':
					overrideSpec(L, l);
					break;

				case 'h':
					overrideSpec(h, H);
					break;
				case 'H':
					overrideSpec(H, h);
					break;

				case 'g':
					overrideSpec(g, G);
					break;
				case 'G':
					overrideSpec(G, g);
					break;

				default:
					fprintf(stderr, "warning: Ignoring '%c' in fix spec\n",
						*musl_optarg);
#undef overrideSpec
				}
				musl_optarg++;
			}
			break;

		case 'i':
			gameID = musl_optarg;
			len = strlen(gameID);
			if (len > 4) {
				len = 4;
				fprintf(stderr, "warning: Truncating game ID \"%s\" to 4 chars\n",
					gameID);
			}
			gameIDLen = len;
			if (titleLen > 11) {
				titleLen = 11;
				fprintf(stderr, "warning: Truncating title \"%s\" to 11 chars\n",
					title);
			}
			break;

		case 'j':
			japanese = false;
			break;

		case 'k':
			newLicensee = musl_optarg;
			len = strlen(newLicensee);
			if (len > 2) {
				len = 2;
				fprintf(stderr,
					"warning: Truncating new licensee \"%s\" to 2 chars\n",
					newLicensee);
			}
			newLicenseeLen = len;
			break;

		case 'l':
			parseByte(oldLicensee, "l");
			break;

		case 'm':
			cartridgeType = parseMBC(musl_optarg);
			if (cartridgeType == MBC_BAD) {
				report("error: Unknown MBC \"%s\"\nAccepted MBC names:\n",
				       musl_optarg);
				printAcceptedMBCNames();
			} else if (cartridgeType == MBC_WRONG_FEATURES) {
				report("error: Features incompatible with MBC (\"%s\")\nAccepted combinations:\n",
				       musl_optarg);
				printAcceptedMBCNames();
			} else if (cartridgeType == MBC_BAD_RANGE) {
				report("error: Specified MBC ID out of range 0-255: %s\n",
				       musl_optarg);
			} else if (cartridgeType == ROM_RAM || cartridgeType == ROM_RAM_BATTERY) {
				fprintf(stderr, "warning: ROM+RAM / ROM+RAM+BATTERY are under-specified and poorly supported\n");
			}
			break;

		case 'n':
			parseByte(romVersion, "n");
			break;

		case 'O':
			overwriteRom = true;
			break;

		case 'p':
			parseByte(padValue, "p");
			break;

		case 'r':
			parseByte(ramSize, "r");
			break;

		case 's':
			sgb = true;
			break;

		case 't': {
			title = musl_optarg;
			len = strlen(title);
			uint8_t maxLen = maxTitleLen();

			if (len > maxLen) {
				len = maxLen;
				fprintf(stderr, "warning: Truncating title \"%s\" to %u chars\n",
					title, maxLen);
			}
			titleLen = len;
			break;
		}

		case 'V':
			printf("rgbfix %s\n", get_package_version_string());
			exit(0);

		case 'v':
			fixSpec = FIX_LOGO | FIX_HEADER_SUM | FIX_GLOBAL_SUM;
			break;

		default:
			fprintf(stderr, "FATAL: unknown option '%c'\n", ch);
			printUsage();
			exit(1);
		}
#undef parseByte
	}

	if ((cartridgeType & 0xFF00) == TPP1 && !japanese)
		fprintf(stderr, "warning: TPP1 overwrites region flag for its identification code, ignoring `-j`\n");

	// Check that RAM size is correct for "standard" mappers
	if (ramSize != UNSPECIFIED && (cartridgeType & 0xFF00) == 0) {
		if (cartridgeType == ROM_RAM || cartridgeType == ROM_RAM_BATTERY) {
			if (ramSize != 1)
				fprintf(stderr, "warning: MBC \"%s\" should have 2 KiB of RAM (-r 1)\n",
					mbcName(cartridgeType));
		} else if (hasRAM(cartridgeType)) {
			if (!ramSize) {
				fprintf(stderr,
					"warning: MBC \"%s\" has RAM, but RAM size was set to 0\n",
					mbcName(cartridgeType));
			} else if (ramSize == 1) {
				fprintf(stderr,
					"warning: RAM size 1 (2 KiB) was specified for MBC \"%s\"\n",
					mbcName(cartridgeType));
			} // TODO: check possible values?
		} else if (ramSize) {
			fprintf(stderr,
				"warning: MBC \"%s\" has no RAM, but RAM size was set to %u\n",
				mbcName(cartridgeType), ramSize);
		}
	}

	if (sgb && oldLicensee != UNSPECIFIED && oldLicensee != 0x33)
		fprintf(stderr,
			"warning: SGB compatibility enabled, but old licensee is 0x%02x, not 0x33\n",
			oldLicensee);

	argv += musl_optind;
	bool failed = nbErrors;

	if (!*argv) {
		fputs("FATAL: Please specify an input file (pass `-` to read from standard input)\n",
		      stderr);
		printUsage();
		exit(1);
	}

	do {
		failed |= processFilename(*argv);
	} while (*++argv);

	return failed;
}